

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O2

Subpalette * __thiscall sfc::Palette::add_subpalette(Palette *this)

{
  long lVar1;
  runtime_error *this_00;
  Subpalette local_60;
  
  lVar1 = (long)(this->_subpalettes).
                super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->_subpalettes).
                super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar1 / 0x50 != (ulong)this->_max_subpalettes) {
    local_60._mode = this->_mode;
    local_60._max_colors = this->_max_colors_per_subpalette;
    local_60._colors_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._colors_set._M_t._M_impl.super__Rb_tree_header._M_header;
    local_60._colors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60._colors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_60._colors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_60._colors_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._colors_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._colors_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._colors_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._colors_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::emplace_back<sfc::Subpalette>
              (&this->_subpalettes,&local_60);
    Subpalette::~Subpalette(&local_60);
    return (this->_subpalettes).
           super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10,0x50,lVar1 % 0x50);
  std::runtime_error::runtime_error(this_00,"Colors don\'t fit in palette");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Subpalette& Palette::add_subpalette() {
  if (_max_subpalettes - _subpalettes.size() == 0)
    throw std::runtime_error("Colors don't fit in palette");
  _subpalettes.emplace_back(Subpalette(_mode, _max_colors_per_subpalette));
  Subpalette& sp = _subpalettes.back();
  return sp;
}